

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCurrentTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1a7e4::TestCanSetAndGetResults::RunImpl(TestCanSetAndGetResults *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  ScopedCurrentTest scopedTest;
  TestResults results;
  
  ScopedCurrentTest::ScopedCurrentTest(&scopedTest);
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  *ppTVar2 = &results;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ScopedCurrentTest::~ScopedCurrentTest(&scopedTest);
  if (pTVar1 != &results) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)&results,*ppTVar3,0x23);
    UnitTest::TestResults::OnTestFailure(pTVar1,(TestDetails *)&results,"ok");
  }
  return;
}

Assistant:

TEST(CanSetAndGetResults)
{
	bool ok = false;
	{
		ScopedCurrentTest scopedTest;

		UnitTest::TestResults results;
		UnitTest::CurrentTest::Results() = &results;

		ok = (UnitTest::CurrentTest::Results() == &results);
	}

	CHECK(ok);
}